

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O2

void __thiscall libtorrent::aux::part_file::~part_file(part_file *this)

{
  error_code ec;
  error_code local_18;
  
  local_18.val_ = 0;
  local_18.failed_ = false;
  local_18.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  flush_metadata_impl(this,&local_18);
  ::std::
  _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_piece_map)._M_h);
  ::std::
  _Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
  ::~_Vector_base(&(this->m_free_slots).
                   super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
                 );
  ::std::__cxx11::string::~string((string *)&this->m_name);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

part_file::~part_file()
	{
		error_code ec;
		flush_metadata_impl(ec);
	}